

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O1

bool __thiscall
BaseModel::detectChessboardCorners
          (BaseModel *this,Mat *image,Size *board_size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *image_points,
          bool draw_corners)

{
  pointer pPVar1;
  pointer pPVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000081;
  Mat gray;
  int local_140;
  int local_13c;
  _InputArray local_138;
  undefined1 local_120 [12];
  undefined4 uStack_114;
  pointer pPStack_110;
  pointer local_108;
  uchar *local_100;
  uchar *puStack_f8;
  MatAllocator *local_f0;
  UMatData *pUStack_e8;
  MatSize local_e0;
  size_t *local_d8;
  size_t local_d0 [4];
  int local_b0;
  int local_ac;
  undefined4 local_a8 [2];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  uchar *local_80;
  
  iVar5 = (int)CONCAT71(in_register_00000081,draw_corners);
  local_80 = (uchar *)0x0;
  local_90._0_4_ = 0x1010000;
  local_b0 = board_size->width;
  local_ac = board_size->height;
  pPStack_110 = (pointer)0x0;
  local_120._0_4_ = -0x7dfcfff3;
  unique0x100003cc = (Mat *)image_points;
  local_90._8_8_ = image;
  cVar3 = cv::findChessboardCorners((Mat *)local_90);
  if (cVar3 != '\0') {
    cv::Mat::Mat((Mat *)local_90);
    pPStack_110 = (pointer)0x0;
    local_120._0_4_ = 0x1010000;
    local_138.sz.width = 0;
    local_138.sz.height = 0;
    local_138.flags = 0x2010000;
    local_138.obj = (Mat *)local_90;
    unique0x100003d4 = image;
    cv::cvtColor((cv *)local_120,&local_138,(_OutputArray *)0x6,0,iVar5);
    pPStack_110 = (pointer)0x0;
    local_120._0_4_ = 0x1010000;
    local_138.sz.width = 0;
    local_138.sz.height = 0;
    local_138.flags = -0x7cfcfff3;
    local_d0[3] = 0xb0000000b;
    local_d0[2] = 0xffffffffffffffff;
    local_138.obj = image_points;
    unique0x100003dc = (Mat *)local_90;
    cv::cornerSubPix(0x9999999a,local_120);
    if (draw_corners) {
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_140 = board_size->width;
      local_13c = board_size->height;
      local_e0.p = (int *)(local_120 + 8);
      local_120._0_4_ = 0x42ff400d;
      local_120._4_4_ = 2;
      pPVar1 = (image_points->
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pPVar2 = (image_points->
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      stack0xfffffffffffffee8 = (Mat *)CONCAT44(1,(int)((ulong)((long)pPVar2 - (long)pPVar1) >> 3));
      local_108 = (pointer)0x0;
      puStack_f8 = (uchar *)0x0;
      local_f0 = (MatAllocator *)0x0;
      pUStack_e8 = (UMatData *)0x0;
      local_d8 = local_d0;
      local_d0[0] = 0;
      local_d0[1] = 0;
      lVar4 = (long)pPVar2 - (long)pPVar1;
      if (lVar4 != 0) {
        local_d0[1] = 8;
        local_d0[0] = 8;
        puStack_f8 = (uchar *)((long)&pPVar1->x + (lVar4 * 0x20000000 >> 0x1d & 0xfffffffffffffff8U)
                              );
        local_108 = pPVar1;
      }
      local_98 = 0;
      local_a8[0] = 0x1010000;
      local_138.obj = image;
      pPStack_110 = local_108;
      local_100 = puStack_f8;
      local_a0 = local_120;
      cv::drawChessboardCorners(&local_138,&local_140,local_a8,1);
      cv::Mat::~Mat((Mat *)local_120);
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  return (bool)cVar3;
}

Assistant:

bool detectChessboardCorners(
    cv::Mat& image,
    const cv::Size& board_size,
    std::vector<cv::Point2f>& image_points,
    bool draw_corners=true
  ) {
    bool found = cv::findChessboardCorners(
      image,
      board_size,
      image_points,
      cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE
    );

    if (found) {
      cv::Mat gray;
      cv::cvtColor(image, gray, cv::COLOR_BGR2GRAY);
    
      cv::cornerSubPix(
	gray,
	image_points,
	cv::Size(11,11),
	cv::Size(-1,-1),
	cv::TermCriteria(cv::TermCriteria::EPS + cv::TermCriteria::COUNT, 30, 0.1)
      );
      
      // image_list_detected.push_back(image_list[i]);
      // object_points_list.push_back(object_points);
      // image_points_list.push_back(image_points);
      
      if (draw_corners)
	cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);
    }
    
    return found;
  }